

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::
     parallel_for<Omega_h::make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::__0>
               (LO n,type *f,char *name)

{
  undefined1 local_60 [8];
  type f2;
  IntIterator last;
  IntIterator first;
  char *name_local;
  type *f_local;
  LO n_local;
  
  f2.dx._4_4_ = 0;
  f2.dx._0_4_ = n;
  make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::$_0::__0((__0 *)local_60,f);
  for_each<Omega_h::IntIterator,Omega_h::make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::__0>
            (f2.dx._4_4_,f2.dx._0_4_,(type *)local_60);
  make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::$_0::~__0((__0 *)local_60);
  return;
}

Assistant:

void parallel_for(LO n, T const& f, char const* name = "") {
#if defined(OMEGA_H_USE_KOKKOS)
  if (n > 0) Kokkos::parallel_for(name, policy(n), f);
#else
  (void)name;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  auto f2 = f;
  ::Omega_h::for_each(first, last, std::move(f2));
#endif
}